

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_sse2.c
# Opt level: O0

void aom_transpose_float_sse2(float *A,float *B,int n)

{
  int in_EDX;
  int x;
  int y;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 4) {
    for (iVar1 = 0; iVar1 < in_EDX; iVar1 = iVar1 + 4) {
      transpose4x4((float *)CONCAT44(in_EDX,iVar2),
                   (float *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                   in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void aom_transpose_float_sse2(const float *A, float *B, int n) {
  for (int y = 0; y < n; y += 4) {
    for (int x = 0; x < n; x += 4) {
      transpose4x4(A + y * n + x, B + x * n + y, n, n);
    }
  }
}